

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O1

stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
* __thiscall
fp::Algorithm::BackTrack
          (stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
           *__return_storage_ptr__,Algorithm *this,array<int,_2UL> current_node,
          array<std::array<fp::Node,_16UL>,_16UL> *node)

{
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  *this_00;
  iterator *piVar1;
  _Elt_pointer paVar2;
  _Type aiVar3;
  _Type aiVar4;
  array<int,_2UL> local_38;
  
  local_38._M_elems[1] = current_node._M_elems[1];
  aiVar4 = *&node->_M_elems[current_node._M_elems[0]]._M_elems[local_38._M_elems[1]].parent_node_.
             _M_elems;
  this_00 = &this->path_stack_;
  paVar2 = (this->path_stack_).c.
           super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  local_38._M_elems = current_node._M_elems;
  if (paVar2 == (this->path_stack_).c.
                super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
    _M_push_back_aux<std::array<int,2ul>const&>
              ((deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)this_00,&local_38);
  }
  else {
    *&paVar2->_M_elems = current_node._M_elems;
    piVar1 = &(this->path_stack_).c.
              super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_38._M_elems != aiVar4) {
    do {
      Maze::ColorPath(local_38);
      local_38._M_elems[1] = aiVar4[1];
      aiVar3 = *&node->_M_elems[aiVar4[0]]._M_elems[local_38._M_elems[1]].parent_node_._M_elems;
      paVar2 = (this->path_stack_).c.
               super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_38._M_elems = aiVar4;
      if (paVar2 == (this->path_stack_).c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>::
        _M_push_back_aux<std::array<int,2ul>const&>
                  ((deque<std::array<int,2ul>,std::allocator<std::array<int,2ul>>> *)this_00,
                   &local_38);
      }
      else {
        *&paVar2->_M_elems = aiVar4;
        piVar1 = &(this->path_stack_).c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      aiVar4 = aiVar3;
    } while (local_38._M_elems != aiVar3);
  }
  std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::deque
            (&__return_storage_ptr__->c,&this_00->c);
  return __return_storage_ptr__;
}

Assistant:

std::stack<std::array<int, 2>>
fp::Algorithm::BackTrack(std::array<int, 2> current_node, std::array<std::array<Node, 16>, 16> &node) {
    std::array<int, 2> parent_node = node[current_node[0]][current_node[1]].parent_node_;
    this->path_stack_.push(current_node);
    while (!(current_node == parent_node)) {
        fp::Maze::ColorPath(current_node);
        current_node = parent_node;
        parent_node = node[current_node[0]][current_node[1]].parent_node_;
        this->path_stack_.push(current_node);
    }
    return this->path_stack_;
}